

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  int iVar1;
  U32 local_3c;
  uint local_38;
  uint local_34;
  U32 local_30;
  U32 u;
  U32 price;
  int optLevel_local;
  optState_t *optPtr_local;
  U32 litLength_local;
  BYTE *literals_local;
  
  if (litLength == 0) {
    literals_local._4_4_ = 0;
  }
  else {
    iVar1 = ZSTD_compressedLiterals(optPtr);
    if (iVar1 == 0) {
      literals_local._4_4_ = litLength << 0xb;
    }
    else if (optPtr->priceType == zop_predef) {
      literals_local._4_4_ = litLength * 0x600;
    }
    else {
      local_30 = litLength * optPtr->litSumBasePrice;
      for (local_34 = 0; local_34 < litLength; local_34 = local_34 + 1) {
        if (optLevel == 0) {
          local_38 = ZSTD_bitWeight(optPtr->litFreq[literals[local_34]]);
        }
        else {
          local_38 = ZSTD_fracWeight(optPtr->litFreq[literals[local_34]]);
        }
        if (optPtr->litSumBasePrice < local_38) {
          __assert_fail("WEIGHT(optPtr->litFreq[literals[u]], optLevel) <= optPtr->litSumBasePrice",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x467d,
                        "U32 ZSTD_rawLiteralsCost(const BYTE *const, const U32, const optState_t *const, int)"
                       );
        }
        if (optLevel == 0) {
          local_3c = ZSTD_bitWeight(optPtr->litFreq[literals[local_34]]);
        }
        else {
          local_3c = ZSTD_fracWeight(optPtr->litFreq[literals[local_34]]);
        }
        local_30 = local_30 - local_3c;
      }
      literals_local._4_4_ = local_30;
    }
  }
  return literals_local._4_4_;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr,
                                int optLevel)
{
    if (litLength == 0) return 0;

    if (!ZSTD_compressedLiterals(optPtr))
        return (litLength << 3) * BITCOST_MULTIPLIER;  /* Uncompressed - 8 bytes per literal. */

    if (optPtr->priceType == zop_predef)
        return (litLength*6) * BITCOST_MULTIPLIER;  /* 6 bit per literal - no statistic used */

    /* dynamic statistics */
    {   U32 price = litLength * optPtr->litSumBasePrice;
        U32 u;
        for (u=0; u < litLength; u++) {
            assert(WEIGHT(optPtr->litFreq[literals[u]], optLevel) <= optPtr->litSumBasePrice);   /* literal cost should never be negative */
            price -= WEIGHT(optPtr->litFreq[literals[u]], optLevel);
        }
        return price;
    }
}